

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O1

QByteArray * parseHtmlMetaForEncoding(QByteArray *__return_storage_ptr__,QByteArrayView data)

{
  long lVar1;
  QArrayData *pQVar2;
  Data *pDVar3;
  bool bVar4;
  qsizetype qVar5;
  long pos;
  char *pcVar6;
  long len;
  long in_FS_OFFSET;
  QByteArray local_78;
  QByteArray local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  qVar5 = 0x400;
  if (data.m_size < 0x400) {
    qVar5 = data.m_size;
  }
  QByteArray::QByteArray(&local_78,data.m_data,qVar5);
  QByteArray::toLower_helper(&local_58,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
    }
  }
  pcVar6 = local_58.d.ptr;
  if (local_58.d.ptr == (char *)0x0) {
    pcVar6 = "";
  }
  qVar5 = QStaticByteArrayMatcherBase::indexOfIn
                    (&parseHtmlMetaForEncoding::metaSearcher.super_QStaticByteArrayMatcherBase,
                     parseHtmlMetaForEncoding::metaSearcher.m_pattern,5,pcVar6,local_58.d.size,0);
  if (qVar5 != -1) {
    pcVar6 = local_58.d.ptr;
    if (local_58.d.ptr == (char *)0x0) {
      pcVar6 = "";
    }
    qVar5 = QStaticByteArrayMatcherBase::indexOfIn
                      (&parseHtmlMetaForEncoding::charsetSearcher.super_QStaticByteArrayMatcherBase,
                       parseHtmlMetaForEncoding::charsetSearcher.m_pattern,8,pcVar6,local_58.d.size,
                       qVar5);
    if (qVar5 != -1) {
      pos = qVar5 + 8;
      if ((pos < local_58.d.size) &&
         ((local_58.d.ptr[pos] == '\'' || (local_58.d.ptr[pos] == '\"')))) {
        pos = qVar5 + 9;
      }
      if (pos + 1 < local_58.d.size) {
        len = 1;
        do {
          if (((ulong)(byte)local_58.d.ptr[len + pos] < 0x3f) &&
             ((0x4000808400000000U >> ((ulong)(byte)local_58.d.ptr[len + pos] & 0x3f) & 1) != 0)) {
            (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
            QByteArray::mid(__return_storage_ptr__,&local_58,pos,len);
            qVar5 = QByteArray::indexOf(__return_storage_ptr__,':',0);
            if (0 < qVar5) {
              QByteArray::left(&local_78,__return_storage_ptr__,qVar5);
              pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
              pcVar6 = (__return_storage_ptr__->d).ptr;
              (__return_storage_ptr__->d).d = local_78.d.d;
              (__return_storage_ptr__->d).ptr = local_78.d.ptr;
              qVar5 = (__return_storage_ptr__->d).size;
              (__return_storage_ptr__->d).size = local_78.d.size;
              local_78.d.d = (Data *)pQVar2;
              local_78.d.ptr = pcVar6;
              local_78.d.size = qVar5;
              if (pQVar2 != (QArrayData *)0x0) {
                LOCK();
                (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(pQVar2,1,0x10);
                }
              }
            }
            QByteArray::simplified_helper(&local_78,__return_storage_ptr__);
            pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
            pcVar6 = (__return_storage_ptr__->d).ptr;
            (__return_storage_ptr__->d).d = local_78.d.d;
            (__return_storage_ptr__->d).ptr = local_78.d.ptr;
            qVar5 = (__return_storage_ptr__->d).size;
            (__return_storage_ptr__->d).size = local_78.d.size;
            local_78.d.ptr = pcVar6;
            local_78.d.size = qVar5;
            if (pQVar2 != (QArrayData *)0x0) {
              LOCK();
              (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                local_78.d.d = (Data *)pQVar2;
                QArrayData::deallocate(pQVar2,1,0x10);
              }
            }
            local_78.d.d = (Data *)0x56b788;
            bVar4 = operator==(__return_storage_ptr__,(char **)&local_78);
            if (bVar4) {
              pQVar2 = &((__return_storage_ptr__->d).d)->super_QArrayData;
              (__return_storage_ptr__->d).d = (Data *)0x0;
              (__return_storage_ptr__->d).ptr = "UTF-8";
              (__return_storage_ptr__->d).size = 5;
              if (pQVar2 != (QArrayData *)0x0) {
                LOCK();
                (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
                     (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(pQVar2,1,0x10);
                }
              }
            }
            if ((__return_storage_ptr__->d).size != 0) goto LAB_0034181d;
            pDVar3 = (__return_storage_ptr__->d).d;
            if (pDVar3 != (Data *)0x0) {
              LOCK();
              (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,1,0x10);
              }
            }
          }
          lVar1 = pos + len;
          len = len + 1;
        } while (lVar1 + 1 < local_58.d.size);
      }
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0034181d:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QByteArray parseHtmlMetaForEncoding(QByteArrayView data)
{
    static constexpr auto metaSearcher = qMakeStaticByteArrayMatcher("meta ");
    static constexpr auto charsetSearcher = qMakeStaticByteArrayMatcher("charset=");

    QByteArray header = data.first(qMin(data.size(), qsizetype(1024))).toByteArray().toLower();
    qsizetype pos = metaSearcher.indexIn(header);
    if (pos != -1) {
        pos = charsetSearcher.indexIn(header, pos);
        if (pos != -1) {
            pos += qstrlen("charset=");
            if (pos < header.size() && (header.at(pos) == '\"' || header.at(pos) == '\''))
                ++pos;

            qsizetype pos2 = pos;
            // The attribute can be closed with either """, "'", ">" or "/",
            // none of which are valid charset characters.
            while (++pos2 < header.size()) {
                char ch = header.at(pos2);
                if (ch == '\"' || ch == '\'' || ch == '>' || ch == '/') {
                    QByteArray name = header.mid(pos, pos2 - pos);
                    qsizetype colon = name.indexOf(':');
                    if (colon > 0)
                        name = name.left(colon);
                    name = name.simplified();
                    if (name == "unicode") // QTBUG-41998, ICU will return UTF-16.
                        name = QByteArrayLiteral("UTF-8");
                    if (!name.isEmpty())
                        return name;
                }
            }
        }
    }
    return QByteArray();
}